

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::ClearAllocators
          (HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  FreeObject *this_01;
  
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>::
  ForEachAllocator<Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>::ClearAllocators()::_lambda(Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>*)_1_>
            ();
  this_01 = this->explicitFreeList;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (this_01 == (FreeObject *)0x0) {
      this->explicitFreeList = (FreeObject *)0x0;
      return;
    }
    this_00 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
              Recycler::FindHeapBlock(((this->super_HeapBucket).heapInfo)->recycler,this_01);
    if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x109,"(heapBlock != nullptr)","heapBlock != nullptr");
      if (!bVar2) goto LAB_0063c101;
      *puVar3 = 0;
    }
    if ((this_00->super_HeapBlock).heapBlockType == LargeBlockType) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x10a,"(!heapBlock->IsLargeHeapBlock())","!heapBlock->IsLargeHeapBlock()")
      ;
      if (!bVar2) {
LAB_0063c101:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearExplicitFreeBitForObject(this_00,this_01)
    ;
    this_01 = FreeObject::GetNext(this_01);
  } while( true );
}

Assistant:

void
HeapBucketT<TBlockType>::ClearAllocators()
{
    ForEachAllocator([](TBlockAllocatorType * allocator) { ClearAllocator(allocator); });

#ifdef RECYCLER_PAGE_HEAP

#endif

#ifdef RECYCLER_MEMORY_VERIFY
    FreeObject* freeObject = this->explicitFreeList;

    while (freeObject)
    {
        HeapBlock* heapBlock = this->GetRecycler()->FindHeapBlock((void*)freeObject);
        Assert(heapBlock != nullptr);
        Assert(!heapBlock->IsLargeHeapBlock());
        TBlockType* smallBlock = (TBlockType*)heapBlock;

        smallBlock->ClearExplicitFreeBitForObject((void*)freeObject);
        freeObject = freeObject->GetNext();
    }
#endif

    this->explicitFreeList = nullptr;
}